

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

int Lodtalk::MethodDictionary::stAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop value_00;
  int iVar2;
  undefined4 extraout_var_03;
  Oop OVar3;
  MethodDictionary *self;
  Oop value;
  Oop key;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  undefined4 extraout_var_02;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    OVar3.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    OVar3.field_0.uintValue._4_4_ = extraout_var_01;
    value_00.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
    value_00.field_0.uintValue._4_4_ = extraout_var_02;
    iVar2 = (**interpreter->_vptr_InterpreterProxy)();
    OVar3 = atPut((MethodDictionary *)CONCAT44(extraout_var_00,iVar1),
                  (VMContext *)CONCAT44(extraout_var_03,iVar2),OVar3,value_00);
    interpreter_local._4_4_ =
         (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar3.field_0);
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int MethodDictionary::stAtPut(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop key = interpreter->getTemporary(0);
    Oop value = interpreter->getTemporary(1);
    auto self = reinterpret_cast<MethodDictionary*> (selfOop.pointer);
    return interpreter->returnOop(self->atPut(interpreter->getContext(), key, value));
}